

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O3

UBool __thiscall
icu_63::ChineseCalendar::isLeapMonthBetween(ChineseCalendar *this,int32_t newMoon1,int32_t newMoon2)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  if (newMoon2 < newMoon1) {
    return '\0';
  }
  uVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                    ((double)(newMoon2 + -0x19),this,0);
  iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x37])(this,newMoon1,(ulong)uVar1);
  bVar3 = true;
  if ((char)iVar2 == '\0') {
    iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x36])(this,(ulong)(uint)newMoon2);
    bVar3 = (char)iVar2 != '\0';
  }
  return bVar3;
}

Assistant:

UBool ChineseCalendar::isLeapMonthBetween(int32_t newMoon1, int32_t newMoon2) const {

#ifdef U_DEBUG_CHNSECAL
    // This is only needed to debug the timeOfAngle divergence bug.
    // Remove this later. Liu 11/9/00
    if (synodicMonthsBetween(newMoon1, newMoon2) >= 50) {
        U_DEBUG_CHNSECAL_MSG((
            "isLeapMonthBetween(%d, %d): Invalid parameters", newMoon1, newMoon2
            ));
    }
#endif

    return (newMoon2 >= newMoon1) &&
        (isLeapMonthBetween(newMoon1, newMoonNear(newMoon2 - SYNODIC_GAP, FALSE)) ||
         hasNoMajorSolarTerm(newMoon2));
}